

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O3

void __thiscall linb::any::swap(any *this,any *rhs)

{
  vtable_type *pvVar1;
  storage_union sStack_28;
  vtable_type *local_18;
  
  pvVar1 = this->vtable;
  local_18 = rhs->vtable;
  if (pvVar1 == local_18) {
    if (pvVar1 != (vtable_type *)0x0) {
      (*pvVar1->swap)(&this->storage,&rhs->storage);
      return;
    }
  }
  else {
    if (local_18 != (vtable_type *)0x0) {
      (*local_18->move)(&rhs->storage,&sStack_28);
      rhs->vtable = (vtable_type *)0x0;
      pvVar1 = this->vtable;
    }
    rhs->vtable = pvVar1;
    if (this->vtable != (vtable_type *)0x0) {
      (*this->vtable->move)(&this->storage,&rhs->storage);
    }
    this->vtable = local_18;
    if (local_18 != (vtable_type *)0x0) {
      (*local_18->move)(&sStack_28,&this->storage);
    }
  }
  return;
}

Assistant:

void swap(any& rhs) noexcept
    {
        if(this->vtable != rhs.vtable)
        {
            any tmp(std::move(rhs));

            // move from *this to rhs.
            rhs.vtable = this->vtable;
            if(this->vtable != nullptr)
            {
                this->vtable->move(this->storage, rhs.storage);
                //this->vtable = nullptr; -- unneeded, see below
            }

            // move from tmp (previously rhs) to *this.
            this->vtable = tmp.vtable;
            if(tmp.vtable != nullptr)
            {
                tmp.vtable->move(tmp.storage, this->storage);
                tmp.vtable = nullptr;
            }
        }
        else // same types
        {
            if(this->vtable != nullptr)
                this->vtable->swap(this->storage, rhs.storage);
        }
    }